

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int iter_config(void *user,char *section,char *name,char *value)

{
  int iVar1;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  trans2p_config *config;
  
  iVar1 = strcmp(in_RSI,"resolver");
  if (iVar1 == 0) {
    iVar1 = strcmp(in_RDX,"bind-addr");
    if (iVar1 == 0) {
      strncpy((char *)(in_RDI + 0x110),in_RCX,0x100);
    }
    iVar1 = strcmp(in_RDX,"bind-port");
    if (iVar1 == 0) {
      iVar1 = atoi(in_RCX);
      *(int *)(in_RDI + 0x210) = iVar1;
      return (uint)(0 < *(int *)(in_RDI + 0x210));
    }
  }
  iVar1 = strcmp(in_RSI,"i2cp");
  if (iVar1 == 0) {
    iVar1 = strcmp(in_RDX,"enabled");
    if (iVar1 == 0) {
      iVar1 = strcmp(in_RCX,"1");
      *(bool *)(in_RDI + 0x318) = iVar1 == 0;
    }
    iVar1 = strcmp(in_RDX,"addr");
    if (iVar1 == 0) {
      strncpy((char *)(in_RDI + 0x214),in_RCX,0x100);
    }
    iVar1 = strcmp(in_RDX,"port");
    if (iVar1 == 0) {
      iVar1 = atoi(in_RCX);
      *(int *)(in_RDI + 0x314) = iVar1;
      return (uint)(0 < *(int *)(in_RDI + 0x314));
    }
  }
  iVar1 = strcmp(in_RSI,"netif");
  if (iVar1 == 0) {
    iVar1 = strcmp(in_RDX,"enabled");
    if (iVar1 == 0) {
      iVar1 = strcmp(in_RCX,"1");
      *(bool *)(in_RDI + 0x10c) = iVar1 == 0;
    }
    iVar1 = strcmp(in_RDX,"addr");
    if (iVar1 == 0) {
      iVar1 = inet_pton(2,in_RCX,(void *)(in_RDI + 0x104));
      return (uint)(iVar1 != -1);
    }
    iVar1 = strcmp(in_RDX,"netmask");
    if (iVar1 == 0) {
      iVar1 = inet_pton(2,in_RCX,(void *)(in_RDI + 0x108));
      return (uint)(iVar1 != -1);
    }
    iVar1 = strcmp(in_RDX,"mtu");
    if (iVar1 == 0) {
      iVar1 = atoi(in_RCX);
      *(int *)(in_RDI + 0x100) = iVar1;
      return (uint)(0 < *(int *)(in_RDI + 0x100));
    }
  }
  return 1;
}

Assistant:

int iter_config(void * user, const char * section, const char * name, const char * value)
{
  struct trans2p_config * config = user;
  if(!strcmp(section, "resolver"))
  {
    if(!strcmp(name, "bind-addr"))
    {
      strncpy(config->dns.addr, value, sizeof(config->dns.addr));
    }
    if(!strcmp(name, "bind-port"))
    {
      config->dns.port = atoi(value);
      return config->dns.port > 0;
    }
  }
  if(!strcmp(section, "i2cp"))
  {
    if(!strcmp(name, "enabled"))
    {
      config->i2cp.enabled = strcmp(value, "1") == 0;
    }
    if(!strcmp(name, "addr"))
    {
      strncpy(config->i2cp.addr, value, sizeof(config->i2cp.addr));
    }
    if(!strcmp(name, "port"))
    {
      config->i2cp.port = atoi(value);
      return config->i2cp.port > 0;
    }
  }
  if(!strcmp(section, "netif"))
  {
    if(!strcmp(name, "enabled"))
    {
      config->tun.enabled = strcmp(value, "1") == 0;
    }
    if(!strcmp(name, "addr"))
    {
      return inet_pton(AF_INET, value, &config->tun.addr) != -1;
    }
    if(!strcmp(name, "netmask"))
    {
      return inet_pton(AF_INET, value, &config->tun.netmask) != -1;
    }
    if(!strcmp(name, "mtu"))
    {
      config->tun.mtu = atoi(value);
      return config->tun.mtu > 0;
    }
  }
  return 1;
}